

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFunctions.h
# Opt level: O3

bool CreateDirPath<char>(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dirname)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  char slashes [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> partialpath;
  char local_54 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_54[2] = 0;
  local_54[0] = '\\';
  local_54[1] = '/';
  strlen(local_54);
  lVar4 = std::__cxx11::string::find_first_of((char *)dirname,(ulong)local_54,1);
  if (lVar4 != -1) {
    do {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)dirname);
      iVar3 = GetFileInfo<char>(&local_50);
      if ((iVar3 == 1) && (bVar1 = CreateDirectory<char>(&local_50), !bVar1)) {
        error("CreateDirectory([%d]%ls)",lVar4,local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        return false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      strlen(local_54);
      lVar4 = std::__cxx11::string::find_first_of((char *)dirname,(ulong)local_54,lVar4 + 1);
    } while (lVar4 != -1);
  }
  bVar1 = true;
  if (((1 < dirname->_M_string_length) && (iVar3 = GetFileInfo<char>(dirname), iVar3 == 1)) &&
     (bVar2 = CreateDirectory<char>(dirname), !bVar2)) {
    bVar1 = false;
    error("CreateDirectory(%s)",(dirname->_M_dataplus)._M_p);
  }
  return bVar1;
}

Assistant:

bool CreateDirPath(const std::basic_string<T>& dirname)
{
    T slashes[3]= { '\\', '/', 0};
    for (size_t i= dirname.find_first_of(slashes, 1) ; i!=dirname.npos ; i= dirname.find_first_of(slashes, i+1)) {
        std::basic_string<T> partialpath= dirname.substr(0, i);
        if (GetFileInfo(partialpath)==AT_NONEXISTANT
            && !CreateDirectory(partialpath)) {
            logerror("CreateDirectory([%d]%ls)", i, partialpath.c_str());
            return false;
        }
    }
    if (dirname.size()>1 && GetFileInfo(dirname)==AT_NONEXISTANT && !CreateDirectory(dirname)) {
        logerror("CreateDirectory(%s)", dirname.c_str());
        return false;
    }
    return true;
}